

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O2

qsizetype __thiscall QXmlStreamReaderPrivate::fastScanContentCharList(QXmlStreamReaderPrivate *this)

{
  QString *this_00;
  qsizetype from;
  uint uVar1;
  uint uVar2;
  uint *puVar3;
  qsizetype qVar4;
  long in_FS_OFFSET;
  QStringView s;
  QArrayDataPointer<char16_t> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &this->textBuffer;
  qVar4 = 0;
LAB_00359976:
  do {
    uVar1 = getChar(this);
    if (uVar1 == 0xffffffff) {
LAB_00359ad0:
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
        __stack_chk_fail();
      }
      return qVar4;
    }
    if ((short)uVar1 == 9) goto LAB_00359a64;
    uVar2 = uVar1 & 0xffff;
    if (uVar2 == 10) {
LAB_00359a48:
      this->lineNumber = this->lineNumber + 1;
      this->lastLineStart = this->readBufferPos + this->characterOffset;
    }
    else {
      if (uVar2 == 0xd) {
        uVar1 = filterCarriageReturn(this);
        if (uVar1 != 0) goto LAB_00359a48;
        goto LAB_00359ad0;
      }
      if (uVar2 != 0x20) {
        if ((uVar2 == 0x26) || (uVar2 == 0x3c)) {
          if ((uVar1 & 0xff0000) != 0) {
LAB_003599f2:
            this->field_0x3a8 = this->field_0x3a8 & 0xfd;
            goto LAB_00359a64;
          }
        }
        else {
          if (uVar2 == 0x5d) {
            this->field_0x3a8 = this->field_0x3a8 & 0xfd;
            from = (this->textBuffer).d.size;
            do {
              QString::append(this_00,(QChar)0x5d);
              qVar4 = qVar4 + 1;
              uVar1 = getChar(this);
            } while (uVar1 == 0x5d);
            if (uVar1 == 0x3e) {
              if ((this->textBuffer).d.ptr[(this->textBuffer).d.size + -2] == L']') {
                QXmlStream::tr((QString *)&local_50,"Sequence \']]>\' not allowed in content.",
                               (char *)0x0,-1);
                raiseWellFormedError(this,(QString *)&local_50);
                QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
                goto LAB_00359ad0;
              }
            }
            else if (uVar1 == 0xffffffff) {
              s.m_data = (this->textBuffer).d.ptr;
              s.m_size = (this->textBuffer).d.size;
              putString(this,s,from);
              QString::resize(this_00,from);
              goto LAB_00359ad0;
            }
            puVar3 = QXmlStreamSimpleStack<unsigned_int>::push(&this->putStack);
            *puVar3 = uVar1;
            goto LAB_00359976;
          }
          if (((1 < uVar2 - 0xfffe) && (uVar2 != 0)) && (0x1f < uVar1)) goto LAB_003599f2;
        }
        puVar3 = QXmlStreamSimpleStack<unsigned_int>::push(&this->putStack);
        *puVar3 = uVar1;
        goto LAB_00359ad0;
      }
    }
LAB_00359a64:
    QString::append(this_00,(QChar)(char16_t)uVar1);
    qVar4 = qVar4 + 1;
  } while( true );
}

Assistant:

inline qsizetype QXmlStreamReaderPrivate::fastScanContentCharList()
{
    qsizetype n = 0;
    uint c;
    while ((c = getChar()) != StreamEOF) {
        switch (ushort(c)) {
        case 0xfffe:
        case 0xffff:
        case 0:
            putChar(c);
            return n;
        case ']': {
            isWhitespace = false;
            const qsizetype pos = textBuffer.size();
            textBuffer += QChar(ushort(c));
            ++n;
            while ((c = getChar()) == ']') {
                textBuffer += QChar(ushort(c));
                ++n;
            }
            if (c == StreamEOF) {
                putString(textBuffer, pos);
                textBuffer.resize(pos);
            } else if (c == '>' && textBuffer.at(textBuffer.size() - 2) == u']') {
                raiseWellFormedError(QXmlStream::tr("Sequence ']]>' not allowed in content."));
            } else {
                putChar(c);
                break;
            }
            return n;
        } break;
        case '\r':
            if ((c = filterCarriageReturn()) == 0)
                return n;
            Q_FALLTHROUGH();
        case '\n':
            ++lineNumber;
            lastLineStart = characterOffset + readBufferPos;
            Q_FALLTHROUGH();
        case ' ':
        case '\t':
            textBuffer += QChar(ushort(c));
            ++n;
            break;
        case '&':
        case '<':
            if (!(c & 0xff0000)) {
                putChar(c);
                return n;
            }
            Q_FALLTHROUGH();
        default:
            if (c < 0x20) {
                putChar(c);
                return n;
            }
            isWhitespace = false;
            textBuffer += QChar(ushort(c));
            ++n;
        }
    }
    return n;
}